

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddBtreeIndex
              (WhereLoopBuilder *pBuilder,SrcList_item *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  WhereLoop *p;
  sqlite3 *psVar4;
  Expr *pEVar5;
  bool bVar6;
  u32 serial_type;
  Parse *pParse;
  WhereLoopBuilder *pWVar7;
  SrcList_item *pSrc_00;
  u32 uVar8;
  byte bVar9;
  LogEst nRet;
  LogEst LVar10;
  short nInMul_00;
  LogEst LVar11;
  int iVar12;
  uint uVar13;
  u32 uVar14;
  u32 uVar15;
  uint uVar16;
  int iVar17;
  WhereTerm *pWVar18;
  char *pcVar19;
  undefined4 extraout_var;
  Mem *pMem;
  undefined4 extraout_var_00;
  ushort uVar20;
  short sVar21;
  short sVar22;
  undefined6 in_register_0000000a;
  undefined8 uVar23;
  uint uVar24;
  uchar *puVar25;
  long lVar26;
  tRowcnt *aStat;
  ulong uVar27;
  u64 x;
  WhereTerm *pWVar28;
  WhereTerm *pWVar29;
  ulong uVar30;
  WhereTerm *pWVar31;
  Parse *pParse_00;
  Select *pSVar32;
  int iVar33;
  u8 uVar34;
  tRowcnt nOut;
  tRowcnt a [2];
  int n;
  WhereScan scan;
  undefined1 local_198 [12];
  uint uStack_18c;
  u32 local_188;
  ushort local_184;
  u16 local_182;
  WhereTerm *local_180;
  WhereTerm *local_178;
  anon_union_8_3_737c4e49_for_u local_170;
  uint local_164;
  ushort local_15e;
  u16 local_15c;
  u16 local_15a;
  uchar *local_158;
  Mem *local_150;
  Parse *local_148;
  ulong local_140;
  Parse *local_138;
  ulong local_130;
  WhereLoopBuilder *local_128;
  uint local_11c;
  ulong local_118;
  SrcList_item *local_110;
  long local_108;
  sqlite3 *local_100;
  u32 local_f4;
  ulong local_f0;
  undefined8 local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  sqlite3 *local_d0;
  CollSeq *local_c8;
  ulong local_c0;
  ulong local_b8;
  Bitmask local_b0;
  u64 local_a8;
  WhereScan local_a0;
  
  local_e8 = CONCAT62(in_register_0000000a,nInMul);
  local_148 = pBuilder->pWInfo->pParse;
  local_100 = local_148->db;
  iVar17 = 7;
  if (local_100->mallocFailed == '\0') {
    p = pBuilder->pNew;
    local_11c = p->wsFlags;
    uVar13 = 0x18;
    if ((local_11c & 0x20) == 0) {
      uVar13 = 0x1bf;
    }
    uVar24 = uVar13 & 0xffffff83;
    if ((*(ushort *)&pProbe->field_0x63 & 4) == 0) {
      uVar24 = uVar13;
    }
    pWVar28 = (WhereTerm *)(ulong)uVar24;
    local_184 = (p->u).btree.nEq;
    local_170._2_6_ = 0;
    local_170.leftColumn._0_2_ = local_184;
    local_15a = (p->u).btree.nBtm;
    local_15c = (p->u).btree.nTop;
    local_15e = p->nSkip;
    local_182 = p->nLTerm;
    local_b0 = p->prereq;
    local_164 = (uint)(ushort)p->nOut;
    local_110 = pSrc;
    pWVar18 = whereScanInit(&local_a0,pBuilder->pWC,pSrc->iCursor,(uint)local_184,uVar24,pProbe);
    p->rSetup = 0;
    local_a8 = (u64)*pProbe->aiRowLogEst;
    iVar17 = 0;
    sVar22 = 0;
    if (10 < (long)local_a8) {
      LVar10 = sqlite3LogEst(local_a8);
      sVar22 = LVar10 + -0x21;
    }
    local_b8 = (ulong)local_182;
    if (pWVar18 != (WhereTerm *)0x0) {
      local_d4 = local_182 + 1;
      local_c0 = (ulong)(uint)(int)sVar22;
      local_178 = (WhereTerm *)0x0;
      local_180 = (WhereTerm *)0x0;
      local_128 = pBuilder;
      do {
        uVar2 = pWVar18->eOperator;
        iVar12 = local_128->nRecValid;
        if ((uVar2 == 0x100) || ((pWVar18->wtFlags & 0x80) != 0)) {
          sVar22 = pProbe->aiColumn[(long)local_170];
          if ((long)sVar22 < 0) {
            uVar34 = sVar22 == -1;
          }
          else {
            uVar34 = pProbe->pTable->aCol[sVar22].notNull;
          }
          if (uVar34 == '\0') goto LAB_0019b872;
          iVar17 = 0;
          iVar33 = 4;
        }
        else {
LAB_0019b872:
          iVar17 = 0;
          iVar33 = 4;
          if ((((pWVar18->prereqRight & p->maskSelf) == 0) &&
              ((uVar2 != 0x10 || ((pWVar18->wtFlags & 0x100) == 0)))) &&
             ((((local_110->fg).jointype & 8) == 0 || ((pWVar18->pExpr->flags & 1) != 0)))) {
            if (pProbe->onError == '\0') {
LAB_0019b8d8:
              uVar13 = 1;
            }
            else {
              uVar13 = 2;
              if (pProbe->nKeyCol - 1 != local_170.leftColumn) goto LAB_0019b8d8;
            }
            local_128->bldFlags = local_128->bldFlags | uVar13;
            p->wsFlags = local_11c;
            (p->u).btree.nEq = local_184;
            (p->u).btree.nBtm = local_15a;
            (p->u).btree.nTop = local_15c;
            p->nLTerm = local_182;
            local_d8 = iVar12;
            iVar12 = whereLoopResize(local_100,p,local_d4);
            iVar33 = 2;
            if (iVar12 == 0) {
              uVar3 = p->nLTerm;
              uVar20 = uVar3 + 1;
              p->nLTerm = uVar20;
              p->aLTerm[uVar3] = pWVar18;
              p->prereq = ~p->maskSelf & (pWVar18->prereqRight | local_b0);
              if ((uVar2 & 1) == 0) {
                if ((uVar2 & 0x82) == 0) {
                  if ((uVar2 >> 8 & 1) == 0) {
                    pWVar28 = pWVar18;
                    if ((uVar2 & 0x24) == 0) {
                      p->wsFlags = p->wsFlags | 0x12;
                      iVar17 = whereRangeVectorLen(local_148,local_110->iCursor,pProbe,
                                                   local_170.leftColumn,pWVar18);
                      (p->u).btree.nTop = (u16)iVar17;
                      uVar30 = 0;
                      local_178 = pWVar18;
                      if ((p->wsFlags & 0x20) == 0) {
                        local_180 = (WhereTerm *)0x0;
                      }
                      else {
                        local_180 = p->aLTerm[(ulong)p->nLTerm - 2];
                      }
                    }
                    else {
                      p->wsFlags = p->wsFlags | 0x22;
                      iVar17 = whereRangeVectorLen(local_148,local_110->iCursor,pProbe,
                                                   local_170.leftColumn,pWVar18);
                      (p->u).btree.nBtm = (u16)iVar17;
                      if ((pWVar18->wtFlags & 0x100) == 0) {
                        uVar30 = 0;
                        local_178 = (WhereTerm *)0x0;
                        local_180 = pWVar18;
                      }
                      else {
                        local_178 = pWVar18 + 1;
                        iVar12 = whereLoopResize(local_100,p,p->nLTerm + 1);
                        iVar17 = 0;
                        local_180 = pWVar18;
                        if (iVar12 != 0) goto LAB_0019bea8;
                        uVar3 = p->nLTerm;
                        p->nLTerm = uVar3 + 1;
                        p->aLTerm[uVar3] = local_178;
                        *(byte *)&p->wsFlags = (byte)p->wsFlags | 0x10;
                        (p->u).btree.nTop = 1;
                        uVar30 = 0;
                      }
                    }
                    goto LAB_0019bb4b;
                  }
                  *(byte *)&p->wsFlags = (byte)p->wsFlags | 8;
                }
                else {
                  sVar22 = pProbe->aiColumn[(long)local_170];
                  uVar13 = p->wsFlags;
                  p->wsFlags = uVar13 | 1;
                  if (sVar22 != -1) {
                    uVar30 = 0;
                    if ((((short)local_e8 == 0) && (-1 < sVar22)) &&
                       (pProbe->nKeyCol - 1 == local_170.leftColumn)) {
                      if (((pProbe->field_0x63 & 8) != 0) ||
                         (((pProbe->nKeyCol == 1 && (uVar2 == 2)) && (pProbe->onError != '\0'))))
                      goto LAB_0019b9fd;
                      p->wsFlags = uVar13 | 0x10001;
                      uVar30 = 0;
                    }
                    goto LAB_0019bb4b;
                  }
LAB_0019b9fd:
                  p->wsFlags = uVar13 | 0x1001;
                }
                uVar30 = 0;
              }
              else {
                pEVar5 = pWVar18->pExpr;
                if ((pEVar5->flags & 0x800) == 0) {
                  uVar30 = 0;
                  if (((pEVar5->x).pList != (ExprList *)0x0) &&
                     (x = (u64)((pEVar5->x).pList)->nExpr, x != 0)) {
                    LVar10 = sqlite3LogEst(x);
                    uVar30 = (ulong)(uint)(int)LVar10;
                  }
                }
                else {
                  uVar30 = 0x2e;
                  pWVar28 = (WhereTerm *)0x0;
                  if (1 < uVar20) {
                    uVar30 = 0x2e;
                    uVar27 = 0;
                    do {
                      if ((p->aLTerm[uVar27] != (WhereTerm *)0x0) &&
                         (p->aLTerm[uVar27]->pExpr == pEVar5)) {
                        uVar30 = 0;
                      }
                      uVar27 = uVar27 + 1;
                    } while (uVar20 - 1 != uVar27);
                  }
                }
                if ((pProbe->field_0x63 & 0x80) == 0) {
LAB_0019bacd:
                  *(byte *)&p->wsFlags = (byte)p->wsFlags | 4;
                  iVar33 = 0;
                }
                else {
                  sVar22 = pProbe->aiRowLogEst[(long)local_170];
                  iVar12 = 0;
                  if (10 < (int)uVar30) {
                    local_f0 = uVar30;
                    LVar10 = sqlite3LogEst(uVar30 & 0xffff);
                    iVar12 = (int)(short)(LVar10 + -0x21);
                    uVar30 = local_f0;
                  }
                  iVar12 = iVar12 + sVar22 + 10;
                  iVar33 = (int)local_c0 + (int)uVar30;
                  if (iVar33 <= iVar12) goto LAB_0019bacd;
                  iVar33 = (uint)(iVar12 < iVar33) << 2;
                }
                if (iVar33 != 0) goto LAB_0019bea8;
              }
LAB_0019bb4b:
              pWVar7 = local_128;
              local_f0 = uVar30;
              if ((p->wsFlags & 2) == 0) {
                uVar13 = (p->u).vtab.idxNum + 1;
                (p->u).btree.nEq = (u16)uVar13;
                if ((pWVar18->truthProb < 1) && (-1 < pProbe->aiColumn[(long)local_170])) {
                  p->nOut = p->nOut + (pWVar18->truthProb - (short)uVar30);
                  iVar33 = 0;
                  iVar17 = 0;
                }
                else {
                  uVar13 = uVar13 & 0xffff;
                  puVar25 = (uchar *)(ulong)uVar13;
                  local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
                  iVar17 = 0;
                  if ((((short)local_e8 == 0) &&
                      ((pProbe->nSample != 0 && ((int)uVar13 <= pProbe->nSampleCol)))) &&
                     ((((uVar2 & 1) == 0 || ((pWVar18->pExpr->flags & 0x800) == 0)) &&
                      ((local_100->dbOptFlags & 0x800) == 0)))) {
                    local_158 = puVar25;
                    if ((uVar2 & 0x182) == 0) {
                      iVar17 = whereInScanEst(local_148,local_128,(pWVar18->pExpr->x).pList,
                                              (tRowcnt *)local_198);
                    }
                    else {
                      iVar17 = whereEqualScanEst(local_148,local_128,pWVar18->pExpr->pRight,
                                                 (tRowcnt *)local_198);
                    }
                    if (iVar17 == 0xc) {
                      iVar17 = 0;
                    }
                    iVar33 = 2;
                    if (iVar17 == 0) {
                      iVar33 = 0;
                      if ((local_198._0_8_ & 0xffffffff) != 0) {
                        LVar10 = sqlite3LogEst(local_198._0_8_ & 0xffffffff);
                        sVar22 = (short)local_164;
                        if (LVar10 < (short)local_164) {
                          sVar22 = LVar10;
                        }
                        p->nOut = sVar22 - (short)local_f0;
                      }
                    }
                    puVar25 = local_158;
                    if (iVar17 != 0) goto LAB_0019bcc4;
                  }
                  if (local_198._0_4_ == 0) {
                    sVar22 = (pProbe->aiRowLogEst[(long)puVar25] -
                             pProbe->aiRowLogEst[(long)(puVar25 + -1)]) + p->nOut;
                    p->nOut = sVar22;
                    if ((uVar2 >> 8 & 1) != 0) {
                      p->nOut = sVar22 + 10;
                    }
                  }
                  iVar33 = 0;
                }
LAB_0019bcc4:
                if (iVar33 != 0) goto LAB_0019bea8;
              }
              else {
                uVar24 = (uint)p->nOut;
                uVar30 = (ulong)uVar24;
                pParse_00 = (Parse *)(p->u).btree.pIndex;
                uVar13 = (pParse_00->constraintName).n;
                pWVar18 = local_178;
                pWVar31 = local_180;
                if (0 < (int)uVar13) {
                  uVar2 = (p->u).btree.nEq;
                  uVar27 = (ulong)uVar2;
                  if (((int)(uint)uVar2 < *(int *)&(pParse_00->constraintName).field_0xc) &&
                     (psVar4 = local_148->db, (psVar4->dbOptFlags & 0x800) == 0)) {
                    local_140 = uVar27;
                    local_138 = pParse_00;
                    local_130 = uVar30;
                    if (local_128->nRecValid == (uint)uVar2) {
                      local_198._0_8_ = local_128->pRec;
                      local_158 = (uchar *)CONCAT44(local_158._4_4_,(uint)(p->u).btree.nBtm);
                      uVar3 = (p->u).btree.nTop;
                      aStat = (tRowcnt *)(ulong)uVar3;
                      if ((Index *)local_198._0_8_ != (Index *)0x0) {
                        *(short *)&((Index *)local_198._0_8_)->aiRowLogEst =
                             (short)local_128->nRecValid;
                      }
                      if (uVar27 == 0) {
                        uVar13 = pParse_00->nTableLock;
                        local_150 = (Mem *)((ulong)local_150 & 0xffffffff00000000);
                      }
                      else {
                        whereKeyStats(pParse_00,(Index *)local_198._0_8_,(UnpackedRecord *)0x0,
                                      (int)local_198 + 8,(tRowcnt *)pWVar28);
                        local_150 = (Mem *)CONCAT44(local_150._4_4_,local_198._8_4_);
                        uVar13 = uStack_18c + local_198._8_4_;
                      }
                      pWVar18 = local_180;
                      pWVar31 = local_178;
                      if (*(char *)(*(long *)&pParse_00->nMem + (ulong)(uint)uVar2) == '\0') {
                        aStat = (tRowcnt *)((ulong)local_158 & 0xffffffff);
                        local_158 = (uchar *)CONCAT44(local_158._4_4_,(uint)uVar3);
                        pWVar18 = local_178;
                        pWVar31 = local_180;
                      }
                      if (pWVar31 == (WhereTerm *)0x0) {
                        iVar17 = -2;
                        pWVar31 = (WhereTerm *)0x0;
                        lVar26 = 0;
                        uVar30 = local_130;
                      }
                      else {
                        pEVar5 = pWVar31->pExpr->pRight;
                        iVar12 = sqlite3Stat4ProbeSetValue
                                           (local_148,(Index *)pParse_00,
                                            (UnpackedRecord **)local_198,pEVar5,(int)aStat,
                                            (int)local_140,(int *)&local_188);
                        lVar26 = CONCAT44(extraout_var,iVar12);
                        iVar17 = -2;
                        uVar30 = local_130;
                        pParse_00 = local_138;
                        if (local_188 != 0 && iVar12 == 0) {
                          uVar34 = pEVar5->op;
                          if (uVar34 == 0xa8) {
                            uVar34 = pEVar5->op2;
                          }
                          if (uVar34 == 0x83) {
                            pSVar32 = (pEVar5->x).pSelect;
LAB_0019c57f:
                            iVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->
                                     nExpr;
                          }
                          else {
                            iVar17 = 1;
                            if (uVar34 == 0xa9) {
                              pSVar32 = (Select *)&pEVar5->x;
                              goto LAB_0019c57f;
                            }
                          }
                          uVar24 = 0xc;
                          if ((int)local_188 < iVar17) {
                            uVar24 = 0x18;
                          }
                          local_108 = lVar26;
                          iVar17 = whereKeyStats(local_138,(Index *)local_198._0_8_,
                                                 (UnpackedRecord *)0x0,(int)local_198 + 8,aStat);
                          uVar24 = pWVar31->eOperator & uVar24;
                          if (uVar24 != 0) {
                            uVar24 = uStack_18c;
                          }
                          uVar16 = (uint)local_150;
                          if ((uint)local_150 < uVar24 + local_198._8_4_) {
                            uVar16 = uVar24 + local_198._8_4_;
                          }
                          local_150 = (Mem *)CONCAT44(local_150._4_4_,uVar16);
                          pWVar31 = (WhereTerm *)0x0;
                          lVar26 = local_108;
                          uVar30 = (ulong)((int)local_130 - 1);
                          pParse_00 = local_138;
                        }
                      }
                      local_118 = CONCAT44(local_118._4_4_,iVar17);
                      if (pWVar18 == (WhereTerm *)0x0) {
                        pWVar18 = (WhereTerm *)0x0;
LAB_0019c67d:
                        uVar24 = (uint)uVar30;
                        iVar17 = (int)lVar26;
                        pWVar29 = (WhereTerm *)0xffffffff;
                      }
                      else {
                        pEVar5 = pWVar18->pExpr->pRight;
                        local_130 = uVar30;
                        iVar17 = sqlite3Stat4ProbeSetValue
                                           (local_148,(Index *)pParse_00,
                                            (UnpackedRecord **)local_198,pEVar5,(int)local_158,
                                            (int)local_140,(int *)&local_188);
                        lVar26 = CONCAT44(extraout_var_00,iVar17);
                        uVar30 = local_130;
                        if (local_188 == 0 || iVar17 != 0) goto LAB_0019c67d;
                        uVar34 = pEVar5->op;
                        if (uVar34 == 0xa8) {
                          uVar34 = pEVar5->op2;
                        }
                        if (uVar34 == 0x83) {
                          pSVar32 = (pEVar5->x).pSelect;
LAB_0019c688:
                          iVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar32->pEList)->pList->nExpr
                          ;
                        }
                        else {
                          iVar17 = 1;
                          if (uVar34 == 0xa9) {
                            pSVar32 = (Select *)&pEVar5->x;
                            goto LAB_0019c688;
                          }
                        }
                        uVar24 = 0xc;
                        if ((int)local_188 < iVar17) {
                          uVar24 = 0x18;
                        }
                        local_108 = lVar26;
                        uVar16 = whereKeyStats(local_138,(Index *)local_198._0_8_,
                                               (UnpackedRecord *)0x1,(int)local_198 + 8,
                                               (tRowcnt *)0xffffffff);
                        pWVar29 = (WhereTerm *)(ulong)uVar16;
                        uVar24 = pWVar18->eOperator & uVar24;
                        if (uVar24 != 0) {
                          uVar24 = uStack_18c;
                        }
                        uVar16 = uVar24 + local_198._8_4_;
                        if (uVar13 <= uVar24 + local_198._8_4_) {
                          uVar16 = uVar13;
                        }
                        uVar24 = (int)local_130 - 1;
                        pWVar18 = (WhereTerm *)0x0;
                        iVar17 = (int)local_108;
                        uVar13 = uVar16;
                      }
                      pWVar7->pRec = (UnpackedRecord *)local_198._0_8_;
                      pWVar28 = pWVar29;
                      if (iVar17 == 0) {
                        uVar16 = 10;
                        if ((uint)local_150 <= uVar13 && uVar13 - (uint)local_150 != 0) {
                          LVar10 = sqlite3LogEst((ulong)(uVar13 - (uint)local_150));
                          sVar22 = LVar10 + -0x14;
                          if ((int)local_118 != (int)pWVar29) {
                            sVar22 = LVar10;
                          }
                          uVar16 = (uint)sVar22;
                        }
                        if ((int)uVar16 <= (int)uVar24) {
                          uVar24 = uVar16;
                        }
                      }
                    }
                    else {
                      lVar26._0_1_ = pParse_00->isMultiWrite;
                      lVar26._1_1_ = pParse_00->mayAbort;
                      lVar26._2_1_ = pParse_00->hasCompound;
                      lVar26._3_1_ = pParse_00->okConstFactor;
                      lVar26._4_1_ = pParse_00->disableLookaside;
                      lVar26._5_1_ = pParse_00->disableVtab;
                      lVar26._6_2_ = *(undefined2 *)&pParse_00->field_0x26;
                      local_d0 = psVar4;
                      if ((lVar26 == 0) &&
                         (pcVar19 = sqlite3IndexAffinityStr(psVar4,(Index *)pParse_00),
                         pcVar19 == (char *)0x0)) {
                        uVar34 = 'A';
                      }
                      else {
                        uVar34 = *(u8 *)(*(long *)&pParse_00->isMultiWrite + uVar27);
                      }
                      pParse = local_148;
                      iVar17 = 0;
                      local_198._0_8_ = (Index *)0x0;
                      stack0xfffffffffffffe70 = (WhereClause *)0x0;
                      local_c8 = sqlite3LocateCollSeq
                                           (local_148,
                                            *(char **)(*(long *)&pParse_00->iSelfTab + uVar27 * 8));
                      if (local_180 == (WhereTerm *)0x0) {
                        local_118 = 0xffffffff;
                      }
                      else {
                        local_118 = 0;
                        pWVar28 = (WhereTerm *)local_198;
                        iVar17 = stat4ValueFromExpr(pParse,local_180->pExpr->pRight,uVar34,
                                                    (ValueNewStat4Ctx *)0x0,
                                                    (sqlite3_value **)pWVar28);
                      }
                      pWVar18 = local_178;
                      uVar13 = uVar13 + 1;
                      if ((local_178 != (WhereTerm *)0x0) && (iVar17 == 0)) {
                        uVar13 = 0;
                        pWVar28 = (WhereTerm *)(local_198 + 8);
                        iVar17 = stat4ValueFromExpr(local_148,local_178->pExpr->pRight,uVar34,
                                                    (ValueNewStat4Ctx *)0x0,
                                                    (sqlite3_value **)pWVar28);
                        if (stack0xfffffffffffffe70 == (WhereClause *)0x0) {
                          uVar13 = (local_138->constraintName).n;
                        }
                      }
                      if (stack0xfffffffffffffe70 == (WhereClause *)0x0 &&
                          (Index *)local_198._0_8_ == (Index *)0x0) {
                        pMem = (sqlite3_value *)0x0;
                      }
                      else {
                        if (iVar17 == 0) {
                          if ((int)(local_138->constraintName).n < 1) {
                            pMem = (sqlite3_value *)0x0;
                          }
                          else {
                            local_140 = (ulong)((int)local_140 + 1);
                            pMem = (Mem *)0x0;
                            lVar26 = 0;
                            uVar30 = local_140;
                            do {
                              local_158 = *(uchar **)(*(long *)&local_138->regRowid + lVar26 * 0x28)
                              ;
                              iVar17 = *(int *)(*(long *)&local_138->regRowid + 8 + lVar26 * 0x28);
                              local_188 = 0;
                              local_150 = pMem;
                              local_108 = lVar26;
                              if ((char)*local_158 < '\0') {
                                bVar9 = sqlite3GetVarint32(local_158,&local_f4);
                                uVar24 = (uint)bVar9;
                              }
                              else {
                                uVar24 = 1;
                                local_f4 = (int)(char)*local_158;
                              }
                              uVar8 = local_f4;
                              puVar25 = local_158;
                              uVar15 = local_f4;
                              local_dc = iVar17;
                              if ((int)uVar24 < (int)local_f4 && (int)local_f4 <= iVar17) {
                                do {
                                  uVar14 = uVar15;
                                  if ((char)puVar25[uVar24] < '\0') {
                                    bVar9 = sqlite3GetVarint32(puVar25 + uVar24,&local_188);
                                    uVar16 = (uint)bVar9;
                                    puVar25 = local_158;
                                  }
                                  else {
                                    uVar16 = 1;
                                    local_188 = (int)(char)puVar25[uVar24];
                                  }
                                  uVar27 = local_140;
                                  serial_type = local_188;
                                  uVar24 = uVar24 + uVar16;
                                  if ((int)uVar8 < (int)uVar24) {
                                    uVar23 = 0x129c7;
                                    goto LAB_0019c3de;
                                  }
                                  if ((ulong)local_188 < 0x80) {
                                    uVar16 = (uint)""[local_188];
                                  }
                                  else {
                                    uVar16 = local_188 - 0xc >> 1;
                                  }
                                  uVar15 = uVar16 + uVar14;
                                  uVar16 = (int)uVar30 - 1;
                                  uVar30 = (ulong)uVar16;
                                } while (uVar16 != 0);
                                if (local_dc < (int)uVar15) {
                                  uVar23 = 0x129cd;
                                  goto LAB_0019c3de;
                                }
                                pMem = local_150;
                                if (local_150 == (Mem *)0x0) {
                                  pMem = (Mem *)sqlite3DbMallocZero(local_d0,0x38);
                                  if (pMem != (Mem *)0x0) {
                                    pMem->flags = 1;
                                    pMem->db = local_d0;
                                    puVar25 = local_158;
                                    goto LAB_0019c4d2;
                                  }
                                  bVar6 = false;
                                }
                                else {
LAB_0019c4d2:
                                  psVar4 = local_d0;
                                  sqlite3VdbeSerialGet(puVar25 + (int)uVar14,serial_type,pMem);
                                  pMem->enc = psVar4->enc;
                                  bVar6 = true;
                                }
                              }
                              else {
                                uVar23 = 0x129c1;
LAB_0019c3de:
                                bVar6 = false;
                                pWVar28 = (WhereTerm *)0x20c207;
                                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",
                                            uVar23);
                                uVar27 = local_140;
                                pMem = local_150;
                              }
                              if ((bool)((Index *)local_198._0_8_ != (Index *)0x0 & bVar6)) {
                                uVar24 = sqlite3MemCompare((Mem *)local_198._0_8_,pMem,local_c8);
                                local_118 = (ulong)(uint)((int)local_118 - ((int)~uVar24 >> 0x1f));
                              }
                              pWVar18 = local_178;
                              if ((bool)(stack0xfffffffffffffe70 != (WhereClause *)0x0 & bVar6)) {
                                uVar24 = sqlite3MemCompare((Mem *)stack0xfffffffffffffe70,pMem,
                                                           local_c8);
                                uVar13 = uVar13 - ((int)~uVar24 >> 0x1f);
                              }
                            } while ((bVar6) &&
                                    (lVar26 = local_108 + 1, uVar30 = uVar27,
                                    lVar26 < (int)(local_138->constraintName).n));
                          }
                        }
                        else {
                          pMem = (sqlite3_value *)0x0;
                        }
                        uVar13 = uVar13 - (int)local_118;
                        uVar30 = (ulong)uVar13;
                        if (((local_180 == (WhereTerm *)0x0) || (pWVar18 == (WhereTerm *)0x0)) ||
                           (1 < (int)uVar13)) {
                          if ((int)uVar13 < 2) {
                            uVar30 = 1;
                          }
                          LVar10 = sqlite3LogEst((long)(int)(local_138->constraintName).n);
                          LVar11 = sqlite3LogEst(uVar30);
                          p->nOut = p->nOut + (LVar11 - LVar10);
                          sqlite3ValueFree((sqlite3_value *)local_198._0_8_);
                          sqlite3ValueFree((sqlite3_value *)stack0xfffffffffffffe70);
                          sqlite3ValueFree(pMem);
                          goto LAB_0019bda9;
                        }
                      }
                      sqlite3ValueFree((sqlite3_value *)local_198._0_8_);
                      sqlite3ValueFree((sqlite3_value *)stack0xfffffffffffffe70);
                      sqlite3ValueFree(pMem);
                      pWVar31 = local_180;
                      uVar24 = (uint)local_130;
                    }
                  }
                }
                uVar13 = uVar24;
                if (pWVar31 != (WhereTerm *)0x0) {
                  if (pWVar31->truthProb < 1) {
                    uVar13 = (ushort)pWVar31->truthProb + uVar24;
                  }
                  else {
                    uVar13 = uVar24 - 0x14;
                    if ((pWVar31->wtFlags & 0x80) != 0) {
                      uVar13 = uVar24;
                    }
                  }
                }
                uVar16 = uVar13;
                if (pWVar18 != (WhereTerm *)0x0) {
                  if (pWVar18->truthProb < 1) {
                    uVar16 = (ushort)pWVar18->truthProb + uVar13;
                  }
                  else {
                    uVar16 = uVar13 - 0x14;
                    if ((pWVar18->wtFlags & 0x80) != 0) {
                      uVar16 = uVar13;
                    }
                  }
                }
                uVar13 = uVar16;
                if (((pWVar31 != (WhereTerm *)0x0) && (pWVar18 != (WhereTerm *)0x0)) &&
                   ((0 < pWVar31->truthProb && (uVar13 = uVar16 - 0x14, pWVar18->truthProb < 1)))) {
                  uVar13 = uVar16;
                }
                iVar17 = uVar24 + (pWVar18 == (WhereTerm *)0x0) + -2 +
                         (uint)(pWVar31 == (WhereTerm *)0x0);
                uVar24 = 10;
                if (10 < (short)uVar13) {
                  uVar24 = uVar13;
                }
                LVar10 = (LogEst)iVar17;
                if ((int)(uVar24 & 0xffff) <= iVar17) {
                  LVar10 = (LogEst)uVar24;
                }
                p->nOut = LVar10;
              }
LAB_0019bda9:
              sVar22 = p->nOut;
              LVar10 = sqlite3LogEstAdd((LogEst)local_c0,
                                        (short)((pProbe->szIdxRow * 0xf) /
                                               (int)local_110->pTab->szTabRow) + sVar22 + 1);
              p->rRun = LVar10;
              if ((p->wsFlags & 0x140) == 0) {
                LVar10 = sqlite3LogEstAdd(LVar10,sVar22 + 0x10);
                p->rRun = LVar10;
              }
              pWVar7 = local_128;
              nInMul_00 = (short)local_f0 + (short)local_e8;
              p->rRun = p->rRun + nInMul_00;
              p->nOut = nInMul_00 + sVar22;
              whereLoopOutputAdjust(local_128->pWC,p,(LogEst)local_a8);
              iVar17 = whereLoopInsert(pWVar7,p);
              sVar21 = (short)local_164;
              if ((p->wsFlags & 2) == 0) {
                sVar21 = sVar22;
              }
              p->nOut = sVar21;
              if (((p->wsFlags & 0x10) == 0) && ((p->u).btree.nEq < pProbe->nColumn)) {
                whereLoopAddBtreeIndex(pWVar7,local_110,pProbe,nInMul_00);
              }
              p->nOut = (LogEst)local_164;
              pWVar7->nRecValid = local_d8;
              iVar33 = 0;
            }
          }
        }
LAB_0019bea8:
        pBuilder = local_128;
      } while (((iVar33 != 2) &&
               (pWVar18 = whereScanNext(&local_a0), pBuilder = local_128, iVar17 == 0)) &&
              (pWVar18 != (WhereTerm *)0x0));
    }
    uVar23 = local_e8;
    pSrc_00 = local_110;
    p->prereq = local_b0;
    (p->u).btree.nEq = local_184;
    (p->u).btree.nBtm = local_15a;
    (p->u).btree.nTop = local_15c;
    p->nSkip = local_15e;
    p->wsFlags = local_11c;
    p->nOut = (LogEst)local_164;
    p->nLTerm = local_182;
    if ((((local_184 == local_15e) && (local_170.leftColumn + 1U < (uint)pProbe->nKeyCol)) &&
        (((pProbe->field_0x63 & 0x40) == 0 &&
         (((local_100->dbOptFlags & 0x4000) == 0 &&
          (0x29 < pProbe->aiRowLogEst[(long)local_170 + 1])))))) &&
       (iVar17 = whereLoopResize(local_100,p,(int)local_b8 + 1), iVar17 == 0)) {
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      p->nSkip = p->nSkip + 1;
      uVar2 = p->nLTerm;
      p->nLTerm = uVar2 + 1;
      p->aLTerm[uVar2] = (WhereTerm *)0x0;
      pbVar1 = (byte *)((long)&p->wsFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      sVar22 = pProbe->aiRowLogEst[(long)local_170] - pProbe->aiRowLogEst[(long)local_170 + 1];
      p->nOut = p->nOut - sVar22;
      whereLoopAddBtreeIndex(pBuilder,pSrc_00,pProbe,sVar22 + (short)uVar23 + 5);
      p->nOut = (LogEst)local_164;
      (p->u).btree.nEq = local_184;
      p->nSkip = local_15e;
      p->wsFlags = local_11c;
      iVar17 = 0;
    }
  }
  return iVar17;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  struct SrcList_item *pSrc,      /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d\n",
                     pProbe->pTable->zName,pProbe->zName, pNew->u.btree.nEq));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* Do not allow constraints from the WHERE clause to be used by the
    ** right table of a LEFT JOIN.  Only constraints in the ON clause are
    ** allowed */
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
    ){
      continue;
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags |= SQLITE_BLDF_UNIQUE;
    }else{
      pBuilder->bldFlags |= SQLITE_BLDF_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0 
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0 
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0 
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
        assert( nIn>0 );  /* RHS always has 2 or more terms...  The parser
                          ** changes "x IN (?)" into "x=?". */
      }
      if( pProbe->hasStat1 ){
        LogEst M, logK, safetyMargin;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the 
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        safetyMargin = 10;  /* TUNING: extra weight for indexed IN */
        if( M + logK + safetyMargin < nIn + rLogSize ){
          WHERETRACE(0x40,
            ("Scan preferred over IN operator on column %d of \"%s\" (%d<%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
          continue;
        }else{
          WHERETRACE(0x40,
            ("IN operator preferred on column %d of \"%s\" (%d>=%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID 
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull 
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ) 
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range contraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all 
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat3/stat4 data. Or, if there is no stat3/stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0 
         && pProbe->nSample 
         && pNew->u.btree.nEq<=pProbe->nSampleCol
         && ((eOp & WO_IN)==0 || !ExprHasProperty(pTerm->pExpr, EP_xIsSelect))
         && OptimizationEnabled(db, SQLITE_Stat34)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a 
            ** "col IS NULL" expression matches twice as many rows 
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18. 
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower. 
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && pProbe->noSkipScan==0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}